

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O0

void __thiscall KrazyMeans::printState(KrazyMeans *this,ostream *labels_out,ostream *centroids_out)

{
  ulong uVar1;
  size_t sVar2;
  ostream *poVar3;
  reference pvVar4;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t c;
  size_t v;
  size_t in_stack_ffffffffffffff38;
  DataSet *in_stack_ffffffffffffff40;
  string *psVar5;
  string local_78 [16];
  FeatureVec *in_stack_ffffffffffffff98;
  ulong local_58;
  string local_40 [32];
  ulong local_20;
  void *local_18;
  void *local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    uVar1 = local_20;
    std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10b8cf);
    sVar2 = DataSet::size((DataSet *)0x10b8d7);
    if (sVar2 <= uVar1) break;
    poVar3 = (ostream *)std::ostream::operator<<(local_10,local_20);
    poVar3 = std::operator<<(poVar3,", ");
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                        local_20);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,", ");
    std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10b955);
    DataSet::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    FeatureVec::toString_abi_cxx11_(in_stack_ffffffffffffff98);
    poVar3 = std::operator<<(poVar3,local_40);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
    local_20 = local_20 + 1;
  }
  for (local_58 = 0; local_58 < *(uint *)(in_RDI + 0x10); local_58 = local_58 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_18,local_58);
    poVar3 = std::operator<<(poVar3,", ");
    std::vector<FeatureVec,_std::allocator<FeatureVec>_>::operator[]
              ((vector<FeatureVec,_std::allocator<FeatureVec>_> *)(in_RDI + 0x38),local_58);
    psVar5 = local_78;
    FeatureVec::toString_abi_cxx11_(in_stack_ffffffffffffff98);
    poVar3 = std::operator<<(poVar3,psVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void KrazyMeans::printState(std::ostream &labels_out, std::ostream &centroids_out) {
  // Print labels for all vectors
  for (size_t v = 0; v < data_set->size(); v++) {
    labels_out << v << ", " << labels[v] << ", " << data_set->vector(v).toString() << std::endl;
  }

  // Print centroids
  for (size_t c = 0; c < num_clusters; c++) {
    centroids_out << c << ", " << centroids[c].toString() << std::endl;
  }
}